

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

string * __thiscall
absl::time_internal::cctz::FixedOffsetToName_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  cctz *__lhs;
  bool bVar1;
  int iVar2;
  rep rVar3;
  char *pcVar4;
  undefined6 in_stack_ffffffffffffff20;
  char cVar5;
  char *in_stack_ffffffffffffff28;
  cctz *in_stack_ffffffffffffff30;
  bool local_b9;
  string *__s;
  allocator<char> local_91;
  char *local_90;
  char *ep;
  char buf [19];
  size_t prefix_len;
  int offset_hours;
  int offset_minutes;
  char sign;
  int offset_seconds;
  duration<long,_std::ratio<3600L,_1L>_> local_50;
  int local_44;
  duration<long,_std::ratio<3600L,_1L>_> local_40 [3];
  allocator<char> local_21;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  cctz *local_18;
  seconds *offset_local;
  
  __s = __return_storage_ptr__;
  local_18 = this;
  offset_local = (seconds *)__return_storage_ptr__;
  local_20 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator==((duration<long,_std::ratio<1L,_1L>_> *)this,&local_20);
  __lhs = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char *)__s
               ,(allocator<char> *)__return_storage_ptr__);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    local_44 = -0x18;
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
              ((duration<long,std::ratio<3600l,1l>> *)local_40,&local_44);
    bVar1 = std::chrono::operator<((duration<long,_std::ratio<1L,_1L>_> *)__lhs,local_40);
    local_b9 = true;
    if (!bVar1) {
      offset_seconds = 0x18;
      in_stack_ffffffffffffff30 = local_18;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&local_50,&offset_seconds);
      local_b9 = std::chrono::operator>
                           ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff30,
                            &local_50);
    }
    if (local_b9 == false) {
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)local_18);
      iVar2 = (int)rVar3;
      cVar5 = '-';
      if (-1 < iVar2) {
        cVar5 = '+';
      }
      prefix_len._4_4_ = iVar2 / 0x3c;
      offset_minutes = iVar2 % 0x3c;
      if (cVar5 == '-') {
        if (0 < offset_minutes) {
          offset_minutes = offset_minutes + -0x3c;
          prefix_len._4_4_ = prefix_len._4_4_ + 1;
        }
        offset_minutes = -offset_minutes;
        prefix_len._4_4_ = -prefix_len._4_4_;
      }
      stack0xffffffffffffff90 = 9;
      pcVar4 = std::copy<char_const*,char*>
                         ((char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          (char *)CONCAT17(cVar5,CONCAT16(0x2b,in_stack_ffffffffffffff20)));
      local_90 = pcVar4 + 1;
      *pcVar4 = cVar5;
      pcVar4 = anon_unknown_0::Format02d(local_90,prefix_len._4_4_ / 0x3c);
      local_90 = pcVar4 + 1;
      *pcVar4 = ':';
      pcVar4 = anon_unknown_0::Format02d(local_90,prefix_len._4_4_ % 0x3c);
      local_90 = pcVar4 + 1;
      *pcVar4 = ':';
      pcVar4 = anon_unknown_0::Format02d(local_90,offset_minutes);
      local_90 = pcVar4 + 1;
      *pcVar4 = '\0';
      if (local_90 != buf + 0xb) {
        __assert_fail("ep == buf + sizeof(buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/time/internal/cctz/src/time_zone_fixed.cc"
                      ,0x74,
                      "std::string absl::time_internal::cctz::FixedOffsetToName(const seconds &)");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)__s,(allocator<char> *)__return_storage_ptr__);
      std::allocator<char>::~allocator(&local_91);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)__s,(allocator<char> *)__return_storage_ptr__);
      std::allocator<char>::~allocator((allocator<char> *)&sign);
    }
  }
  return __s;
}

Assistant:

std::string FixedOffsetToName(const seconds& offset) {
  if (offset == seconds::zero()) return "UTC";
  if (offset < std::chrono::hours(-24) || offset > std::chrono::hours(24)) {
    // We don't support fixed-offset zones more than 24 hours
    // away from UTC to avoid complications in rendering such
    // offsets and to (somewhat) limit the total number of zones.
    return "UTC";
  }
  int offset_seconds = static_cast<int>(offset.count());
  const char sign = (offset_seconds < 0 ? '-' : '+');
  int offset_minutes = offset_seconds / 60;
  offset_seconds %= 60;
  if (sign == '-') {
    if (offset_seconds > 0) {
      offset_seconds -= 60;
      offset_minutes += 1;
    }
    offset_seconds = -offset_seconds;
    offset_minutes = -offset_minutes;
  }
  int offset_hours = offset_minutes / 60;
  offset_minutes %= 60;
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  char buf[prefix_len + sizeof("-24:00:00")];
  char* ep = std::copy(kFixedZonePrefix, kFixedZonePrefix + prefix_len, buf);
  *ep++ = sign;
  ep = Format02d(ep, offset_hours);
  *ep++ = ':';
  ep = Format02d(ep, offset_minutes);
  *ep++ = ':';
  ep = Format02d(ep, offset_seconds);
  *ep++ = '\0';
  assert(ep == buf + sizeof(buf));
  return buf;
}